

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O3

int ImgIoUtilCheckSizeArgumentsOverflow(uint64_t stride,size_t height)

{
  return (int)((long)(int)stride == stride);
}

Assistant:

int ImgIoUtilCheckSizeArgumentsOverflow(uint64_t stride, size_t height) {
  const uint64_t total_size = stride * height;
  int ok = (total_size == (size_t)total_size);
  // check that 'stride' is representable as int:
  ok = ok && ((uint64_t)(int)stride == stride);
#if defined(WEBP_MAX_IMAGE_SIZE)
  ok = ok && (total_size <= (uint64_t)WEBP_MAX_IMAGE_SIZE);
#endif
  return ok;
}